

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O2

REF_STATUS ref_metric_inspect(REF_NODE ref_node)

{
  uint uVar1;
  long lVar2;
  REF_DBL m [6];
  
  lVar2 = 0;
  do {
    if (ref_node->max <= lVar2) {
      return 0;
    }
    if (-1 < ref_node->global[lVar2]) {
      uVar1 = ref_node_metric_get(ref_node,(REF_INT)lVar2,m);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0x36,"ref_metric_inspect",(ulong)uVar1,"get");
        return uVar1;
      }
      ref_metric_show(m);
    }
    lVar2 = lVar2 + 1;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_metric_inspect(REF_NODE ref_node) {
  REF_INT node;
  REF_DBL m[6];
  each_ref_node_valid_node(ref_node, node) {
    RSS(ref_node_metric_get(ref_node, node, m), "get");
    RSS(ref_metric_show(m), "show it");
  }
  return REF_SUCCESS;
}